

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O1

string * __thiscall
SchemaConverter::_add_primitive
          (string *__return_storage_ptr__,SchemaConverter *this,string *name,BuiltinRule *rule)

{
  pointer pbVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_true>
  _Var2;
  iterator iVar3;
  long *plVar4;
  size_type *psVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  pointer __k;
  BuiltinRule dep_rule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c0;
  _Base_ptr local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  _add_rule(__return_storage_ptr__,this,name,&rule->content);
  __k = (rule->deps).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (rule->deps).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar1) {
    local_b0 = &this->_rules;
    local_b8 = &(this->_rules)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->_errors;
    do {
      local_80 = 0;
      local_78 = 0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88 = &local_78;
      _Var2._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&PRIMITIVE_RULES_abi_cxx11_._M_h,__k);
      if ((_Var2._M_cur == (__node_type *)0x0) &&
         (_Var2._M_cur = (__node_type *)
                         std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(&STRING_FORMAT_RULES_abi_cxx11_._M_h,__k),
         _Var2._M_cur == (__node_type *)0x0)) {
        std::operator+(&local_a8,"Rule ",__k);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_e0.field_2._M_allocated_capacity = *psVar5;
          local_e0.field_2._8_8_ = plVar4[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar5;
          local_e0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_e0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_c0,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        uVar6 = local_a8.field_2._M_allocated_capacity;
        _Var7._M_p = local_a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_00207c99:
          operator_delete(_Var7._M_p,uVar6 + 1);
        }
      }
      else {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_b0->_M_t,__k);
        if ((iVar3._M_node == local_b8) &&
           (_add_primitive(&local_50,this,__k,
                           (BuiltinRule *)
                           ((long)&((_Var2._M_cur)->
                                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>
                                   ._M_storage._M_storage + 0x20)),
           uVar6 = local_50.field_2._M_allocated_capacity, _Var7._M_p = local_50._M_dataplus._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_50._M_dataplus._M_p != &local_50.field_2)) goto LAB_00207c99;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
      __k = __k + 1;
    } while (__k != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _add_primitive(const std::string & name, const BuiltinRule & rule) {
        auto n = _add_rule(name, rule.content);
        for (const auto & dep : rule.deps) {
            BuiltinRule dep_rule;
            auto it = PRIMITIVE_RULES.find(dep);
            if (it == PRIMITIVE_RULES.end()) {
                it = STRING_FORMAT_RULES.find(dep);
                if (it == STRING_FORMAT_RULES.end()) {
                    _errors.push_back("Rule " + dep + " not known");
                    continue;
                }
            }
            if (_rules.find(dep) == _rules.end()) {
                _add_primitive(dep, it->second);
            }
        }
        return n;
    }